

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

bool duckdb::AllowCommunityExtensionsSetting::OnGlobalReset(DatabaseInstance *db,DBConfig *config)

{
  bool bVar1;
  InvalidInputException *this;
  __native_type local_6c0 [21];
  char local_36f;
  
  bVar1 = true;
  if ((db != (DatabaseInstance *)0x0) && ((config->options).allow_community_extensions == false)) {
    DBConfig::DBConfig((DBConfig *)&local_6c0[0].__data);
    DBConfig::~DBConfig((DBConfig *)&local_6c0[0].__data);
    if (local_36f == '\x01') {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_6c0[0]._0_8_ = &local_6c0[0].__data.__kind;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6c0,
                 "Cannot upgrade allow_community_extensions setting while database is running","");
      InvalidInputException::InvalidInputException(this,(string *)&local_6c0[0].__data);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AllowCommunityExtensionsSetting::OnGlobalReset(DatabaseInstance *db, DBConfig &config) {
	if (db && !config.options.allow_community_extensions) {
		if (DBConfig().options.allow_community_extensions) {
			throw InvalidInputException("Cannot upgrade allow_community_extensions setting while database is running");
		}
		return false;
	}
	return true;
}